

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void WebPMultRow_C(uint8_t *ptr,uint8_t *alpha,int width,int inverse)

{
  uint a_00;
  uint32_t uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint32_t scale;
  uint32_t a;
  int x;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    a_00 = (uint)*(byte *)(in_RSI + local_1c);
    if (a_00 != 0xff) {
      if (a_00 == 0) {
        *(undefined1 *)(in_RDI + local_1c) = 0;
      }
      else {
        uVar1 = GetScale(a_00,in_ECX);
        uVar1 = Mult(*(uint8_t *)(in_RDI + local_1c),uVar1);
        *(char *)(in_RDI + local_1c) = (char)uVar1;
      }
    }
  }
  return;
}

Assistant:

void WebPMultRow_C(uint8_t* WEBP_RESTRICT const ptr,
                   const uint8_t* WEBP_RESTRICT const alpha,
                   int width, int inverse) {
  int x;
  for (x = 0; x < width; ++x) {
    const uint32_t a = alpha[x];
    if (a != 255) {
      if (a == 0) {
        ptr[x] = 0;
      } else {
        const uint32_t scale = GetScale(a, inverse);
        ptr[x] = Mult(ptr[x], scale);
      }
    }
  }
}